

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy_toplex_map.h
# Opt level: O2

void __thiscall
Gudhi::Lazy_toplex_map::
insert_independent_simplex<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
          (Lazy_toplex_map *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  _Rb_tree_node_base *__k;
  undefined8 in_RAX;
  size_type sVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (p_Var3 = (vertex_range->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(vertex_range->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    __k = p_Var3 + 1;
    sVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this,(key_type *)__k);
    if (sVar1 == 0) {
      uStack_38 = CONCAT44(1,(undefined4)uStack_38);
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long_const&,int>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this,__k,(long)&uStack_38 + 4);
    }
    else {
      pmVar2 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,(key_type *)__k);
      *pmVar2 = *pmVar2 + 1;
    }
  }
  this->size_lbound = this->size_lbound + 1;
  insert_simplex<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
            (this,vertex_range);
  return;
}

Assistant:

void Lazy_toplex_map::insert_independent_simplex(const Input_vertex_range &vertex_range) {
  for (const Vertex &v : vertex_range)
    if (!gamma0_lbounds.count(v))
      gamma0_lbounds.emplace(v, 1);
    else
      gamma0_lbounds[v]++;
  size_lbound++;
  insert_simplex(vertex_range);
}